

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaFacetErr(xmlSchemaAbstractCtxtPtr actxt,xmlParserErrors error,xmlNodePtr node,
                      xmlChar *value,unsigned_long length,xmlSchemaTypePtr type,
                      xmlSchemaFacetPtr facet,char *message,xmlChar *str1,xmlChar *str2)

{
  xmlSchemaFacetPtr pxVar1;
  xmlSchemaWhitespaceValueType ws;
  int iVar2;
  xmlElementType *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  unsigned_long uVar6;
  xmlParserErrors error_00;
  xmlSchemaTypeType type_00;
  char *pcVar7;
  xmlSchemaFacetPtr *ppxVar8;
  bool bVar9;
  xmlChar *local_a8;
  xmlSchemaAbstractCtxtPtr local_a0;
  xmlParserErrors local_94;
  xmlChar *local_90;
  char len [25];
  char actLen [25];
  
  local_a8 = (xmlChar *)0x0;
  if (node == (xmlNodePtr)0x0) {
    if ((actxt->type == 2) &&
       (pxVar3 = *(xmlElementType **)(actxt + 0xc), pxVar3 != (xmlElementType *)0x0))
    goto LAB_001bac88;
    bVar9 = false;
  }
  else {
    pxVar3 = &node->type;
LAB_001bac88:
    bVar9 = *pxVar3 == XML_ATTRIBUTE_NODE;
  }
  local_a0 = actxt;
  local_90 = value;
  xmlSchemaFormatNodeForError(&local_a8,actxt,node);
  type_00 = XML_SCHEMA_FACET_ENUMERATION;
  if (error != XML_SCHEMAV_CVC_ENUMERATION_VALID) {
    type_00 = facet->type;
  }
  local_94 = error;
  local_a8 = xmlStrcat(local_a8,"[");
  pxVar4 = xmlStrcat(local_a8,(xmlChar *)"facet \'");
  local_a8 = pxVar4;
  pxVar5 = xmlSchemaFacetTypeToString(type_00);
  local_a8 = xmlStrcat(pxVar4,pxVar5);
  local_a8 = xmlStrcat(local_a8,(xmlChar *)"\'] ");
  error_00 = local_94;
  if (type_00 - XML_SCHEMA_FACET_LENGTH < 3) {
    pcVar7 = "The value has a length of \'%s\'; ";
    if (bVar9) {
      pcVar7 = "The value \'%s\' has a length of \'%s\'; ";
    }
    local_a8 = xmlStrcat(local_a8,(xmlChar *)pcVar7);
    uVar6 = xmlSchemaGetFacetValueAsULong(facet);
    snprintf(len,0x18,"%lu",uVar6);
    snprintf(actLen,0x18,"%lu",length);
    error_00 = local_94;
    if (type_00 == XML_SCHEMA_FACET_MINLENGTH) {
      local_a8 = xmlStrcat(local_a8,(xmlChar *)
                                    "this underruns the allowed minimum length of \'%s\'.\n");
      error_00 = local_94;
    }
    else {
      if (type_00 == XML_SCHEMA_FACET_MAXLENGTH) {
        pcVar7 = "this exceeds the allowed maximum length of \'%s\'.\n";
      }
      else {
        pcVar7 = "this differs from the allowed length of \'%s\'.\n";
      }
      local_a8 = xmlStrcat(local_a8,(xmlChar *)pcVar7);
    }
    if (bVar9) {
      xmlSchemaErr3(local_a0,error_00,node,(char *)local_a8,local_90,(xmlChar *)actLen,
                    (xmlChar *)len);
      goto LAB_001bafc1;
    }
    pxVar5 = (xmlChar *)len;
    pxVar4 = (xmlChar *)actLen;
  }
  else {
    switch(type_00) {
    case XML_SCHEMA_FACET_MININCLUSIVE:
      pcVar7 = "The value \'%s\' is less than the minimum value allowed (\'%s\').\n";
      break;
    case XML_SCHEMA_FACET_MINEXCLUSIVE:
      pcVar7 = "The value \'%s\' must be greater than \'%s\'.\n";
      break;
    case XML_SCHEMA_FACET_MAXINCLUSIVE:
      pcVar7 = "The value \'%s\' is greater than the maximum value allowed (\'%s\').\n";
      break;
    case XML_SCHEMA_FACET_MAXEXCLUSIVE:
      pcVar7 = "The value \'%s\' must be less than \'%s\'.\n";
      break;
    case XML_SCHEMA_FACET_TOTALDIGITS:
      pcVar7 = "The value \'%s\' has more digits than are allowed (\'%s\').\n";
      break;
    case XML_SCHEMA_FACET_FRACTIONDIGITS:
      pcVar7 = "The value \'%s\' has more fractional digits than are allowed (\'%s\').\n";
      break;
    case XML_SCHEMA_FACET_PATTERN:
      pcVar7 = "The value \'%s\' is not accepted by the pattern \'%s\'.\n";
      break;
    case XML_SCHEMA_FACET_ENUMERATION:
      pxVar4 = xmlStrcat(local_a8,(xmlChar *)"The value \'%s\' is not an element of the set {%s}.\n"
                        );
      len[0] = '\0';
      len[1] = '\0';
      len[2] = '\0';
      len[3] = '\0';
      len[4] = '\0';
      len[5] = '\0';
      len[6] = '\0';
      len[7] = '\0';
      pxVar5 = (xmlChar *)0x0;
      local_a8 = pxVar4;
      do {
        ws = xmlSchemaGetWhiteSpaceFacetValue(type->baseType);
        bVar9 = false;
        ppxVar8 = &type->facets;
        while (pxVar1 = *ppxVar8, pxVar1 != (xmlSchemaFacetPtr)0x0) {
          if (pxVar1->type == XML_SCHEMA_FACET_ENUMERATION) {
            iVar2 = xmlSchemaGetCanonValueWhtspExt(pxVar1->val,ws,(xmlChar **)len);
            if (iVar2 == -1) {
              xmlSchemaInternalErr
                        (local_a0,"xmlSchemaFormatFacetEnumSet",
                         "compute the canonical lexical representation");
              if (pxVar5 != (xmlChar *)0x0) {
                (*xmlFree)(pxVar5);
              }
              pxVar5 = (xmlChar *)0x0;
              goto LAB_001bb045;
            }
            if (pxVar5 == (xmlChar *)0x0) {
              pxVar5 = xmlStrdup("\'");
            }
            else {
              pxVar5 = xmlStrcat(pxVar5,(xmlChar *)", \'");
            }
            pxVar5 = xmlStrcat(pxVar5,(xmlChar *)len._0_8_);
            pxVar5 = xmlStrcat(pxVar5,"\'");
            if (len._0_8_ != 0) {
              (*xmlFree)((void *)len._0_8_);
              len[0] = '\0';
              len[1] = '\0';
              len[2] = '\0';
              len[3] = '\0';
              len[4] = '\0';
              len[5] = '\0';
              len[6] = '\0';
              len[7] = '\0';
            }
            bVar9 = true;
          }
          ppxVar8 = &pxVar1->next;
        }
      } while (((!bVar9) && (type = type->baseType, type != (xmlSchemaTypePtr)0x0)) &&
              (type->type != XML_SCHEMA_TYPE_BASIC));
LAB_001bb045:
      xmlSchemaErr(local_a0,local_94,node,(char *)pxVar4,local_90,pxVar5);
      if (pxVar5 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar5);
      }
      goto LAB_001bafc1;
    default:
      if (bVar9) {
        local_a8 = xmlStrcat(local_a8,(xmlChar *)"The value \'%s\' is not facet-valid.\n");
        pxVar4 = local_90;
      }
      else {
        local_a8 = xmlStrcat(local_a8,(xmlChar *)"The value is not facet-valid.\n");
        pxVar4 = (xmlChar *)0x0;
      }
      pxVar5 = (xmlChar *)0x0;
      goto LAB_001bafbc;
    }
    local_a8 = xmlStrcat(local_a8,(xmlChar *)pcVar7);
    pxVar5 = facet->value;
    pxVar4 = local_90;
  }
LAB_001bafbc:
  xmlSchemaErr(local_a0,error_00,node,(char *)local_a8,pxVar4,pxVar5);
LAB_001bafc1:
  (*xmlFree)(local_a8);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(8,0)
xmlSchemaFacetErr(xmlSchemaAbstractCtxtPtr actxt,
		  xmlParserErrors error,
		  xmlNodePtr node,
		  const xmlChar *value,
		  unsigned long length,
		  xmlSchemaTypePtr type,
		  xmlSchemaFacetPtr facet,
		  const char *message,
		  const xmlChar *str1,
		  const xmlChar *str2)
{
    xmlChar *str = NULL, *msg = NULL;
    xmlSchemaTypeType facetType;
    int nodeType = xmlSchemaEvalErrorNodeType(actxt, node);

    xmlSchemaFormatNodeForError(&msg, actxt, node);
    if (error == XML_SCHEMAV_CVC_ENUMERATION_VALID) {
	facetType = XML_SCHEMA_FACET_ENUMERATION;
	/*
	* If enumerations are validated, one must not expect the
	* facet to be given.
	*/
    }